

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

string * __thiscall
CGL::Application::info_abi_cxx11_(string *__return_storage_ptr__,Application *this)

{
  char *pcVar1;
  char *pcVar2;
  
  if (this->mode - RENDER_MODE < 2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "renderer";
    pcVar1 = "";
  }
  else if (this->mode == EDIT_MODE) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "MeshEdit";
    pcVar1 = "";
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = "";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

string Application::info() {
  switch (mode) {
    case EDIT_MODE:
      return "MeshEdit";
      break;
    case RENDER_MODE:
    case VISUALIZE_MODE:
      return "renderer";
      break;
  }
  return "";
}